

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::ComputeShaderTest::ComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "layout(local_size_x = 1, local_size_y = 1) in; \nlayout(std430) buffer Output {                 \n   vec4 data[];                                \n} g_out;                                       \nvoid main() {                                   \n   g_out.data[0] = vec4(1.0, 2.0, 3.0, 4.0);    \n   g_out.data[100] = vec4(1.0, 2.0, 3.0, 4.0);  \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ComputeShader()
	{
		return "layout(local_size_x = 1, local_size_y = 1) in; \n"
			   "layout(std430) buffer Output {                 \n"
			   "   vec4 data[];                                \n"
			   "} g_out;                                       \n"
			   ""
			   "void main() {                                   \n"
			   "   g_out.data[0] = vec4(1.0, 2.0, 3.0, 4.0);    \n"
			   "   g_out.data[100] = vec4(1.0, 2.0, 3.0, 4.0);  \n"
			   "}";
	}